

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void do_xrstor_sse(CPUX86State *env,target_ulong ptr,uintptr_t ra)

{
  uint64_t uVar1;
  target_ulong local_30;
  target_ulong addr;
  int nb_xmm_regs;
  int i;
  uintptr_t ra_local;
  target_ulong ptr_local;
  CPUX86State *env_local;
  
  if ((env->hflags & 0x8000) == 0) {
    addr._0_4_ = 8;
  }
  else {
    addr._0_4_ = 0x10;
  }
  local_30 = ptr + 0xa0;
  for (addr._4_4_ = 0; addr._4_4_ < (int)addr; addr._4_4_ = addr._4_4_ + 1) {
    uVar1 = cpu_ldq_data_ra_x86_64(env,local_30,ra);
    env->xmm_regs[addr._4_4_]._q_ZMMReg[0] = uVar1;
    uVar1 = cpu_ldq_data_ra_x86_64(env,local_30 + 8,ra);
    *(uint64_t *)((long)env->xmm_regs + (long)addr._4_4_ * 0x40 + 8) = uVar1;
    local_30 = local_30 + 0x10;
  }
  return;
}

Assistant:

static void do_xrstor_sse(CPUX86State *env, target_ulong ptr, uintptr_t ra)
{
    int i, nb_xmm_regs;
    target_ulong addr;

    if (env->hflags & HF_CS64_MASK) {
        nb_xmm_regs = 16;
    } else {
        nb_xmm_regs = 8;
    }

    addr = ptr + XO(legacy.xmm_regs);
    for (i = 0; i < nb_xmm_regs; i++) {
        env->xmm_regs[i].ZMM_Q(0) = cpu_ldq_data_ra(env, addr, ra);
        env->xmm_regs[i].ZMM_Q(1) = cpu_ldq_data_ra(env, addr + 8, ra);
        addr += 16;
    }
}